

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::ConvertToHalfPass::FloatVectorType
          (ConvertToHalfPass *this,uint32_t v_len,uint32_t width)

{
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar1;
  undefined1 local_58 [8];
  Vector vec_ty;
  Type *reg_float_ty;
  uint32_t width_local;
  uint32_t v_len_local;
  ConvertToHalfPass *this_local;
  
  vec_ty._48_8_ = FloatScalarType(this,width);
  analysis::Vector::Vector((Vector *)local_58,(Type *)vec_ty._48_8_,v_len);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar1 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)local_58);
  analysis::Vector::~Vector((Vector *)local_58);
  return pTVar1;
}

Assistant:

analysis::Type* ConvertToHalfPass::FloatVectorType(uint32_t v_len,
                                                   uint32_t width) {
  analysis::Type* reg_float_ty = FloatScalarType(width);
  analysis::Vector vec_ty(reg_float_ty, v_len);
  return context()->get_type_mgr()->GetRegisteredType(&vec_ty);
}